

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rhombicLattice.cpp
# Opt level: O2

void __thiscall RhombicLattice::createUpEdgesMap(RhombicLattice *this)

{
  int iVar1;
  bool bVar2;
  uint uVar3;
  ulong uVar4;
  long lVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__x;
  vector<int,_std::allocator<int>_> *pvVar6;
  cartesian4 cVar7;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  allocator local_199 [13];
  int local_18c;
  long local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_180;
  vvint vertexToUpEdges;
  allocator_type local_15e;
  allocator local_15d;
  allocator local_15c;
  allocator local_15b;
  allocator local_15a;
  allocator local_159;
  undefined1 local_158 [64];
  string local_118 [32];
  string local_f8 [32];
  string local_d8 [32];
  string local_b8 [32];
  string local_98 [32];
  string local_78 [32];
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>>>>
  *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_50;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  directionList;
  
  std::__cxx11::string::string((string *)local_158,"xyz",(allocator *)&vertexToUpEdges);
  std::__cxx11::string::string((string *)(local_158 + 0x20),"xy",(allocator *)&local_18c);
  std::__cxx11::string::string(local_118,"xz",local_199);
  std::__cxx11::string::string(local_f8,"yz",&local_159);
  std::__cxx11::string::string(local_d8,"-xyz",&local_15a);
  std::__cxx11::string::string(local_b8,"-xy",&local_15b);
  std::__cxx11::string::string(local_98,"-xz",&local_15c);
  std::__cxx11::string::string(local_78,"-yz",&local_15d);
  __l._M_len = 8;
  __l._M_array = (iterator)local_158;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&directionList,__l,&local_15e);
  lVar5 = 0xe0;
  do {
    std::__cxx11::string::~string((string *)(local_158 + lVar5));
    lVar5 = lVar5 + -0x20;
  } while (lVar5 != -0x20);
  local_50 = directionList.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  local_58 = (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>>>>
              *)&(this->super_Lattice).upEdgesMap;
  __x = directionList.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start;
  do {
    if (__x == local_50) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&directionList);
      return;
    }
    vertexToUpEdges.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    vertexToUpEdges.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    vertexToUpEdges.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    iVar1 = (this->super_Lattice).l;
    local_158._0_8_ = (pointer)0x0;
    local_158._8_8_ = (pointer)0x0;
    local_158._16_8_ = 0;
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::_M_fill_assign(&vertexToUpEdges,(long)(iVar1 * iVar1 * iVar1 * 2),(value_type *)local_158);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)local_158);
    local_188 = 0;
    uVar4 = 0;
    local_180 = __x;
    while( true ) {
      iVar1 = (this->super_Lattice).l;
      if ((long)(iVar1 * iVar1 * iVar1 * 2) <= (long)uVar4) break;
      cVar7 = Lattice::indexToCoordinate(&this->super_Lattice,(int)uVar4);
      uVar3 = cVar7.y + cVar7.x + cVar7.z & 0x80000001;
      if (cVar7._8_8_ >> 0x20 == 0) {
        if (uVar3 == 1) {
          bVar2 = std::operator==(__x,"xyz");
          if (bVar2) {
            pvVar6 = (vector<int,_std::allocator<int>_> *)
                     ((long)&((vertexToUpEdges.
                               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->
                             super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                             super__Vector_impl_data._M_start + local_188);
            std::__cxx11::string::string((string *)local_158,"xyz",local_199);
            __x = local_180;
            local_18c = (*(this->super_Lattice)._vptr_Lattice[2])
                                  (this,uVar4 & 0xffffffff,
                                   (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
                                    *)local_158,1);
            std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar6,&local_18c);
            std::__cxx11::string::~string((string *)local_158);
            pvVar6 = (vector<int,_std::allocator<int>_> *)
                     ((long)&((vertexToUpEdges.
                               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->
                             super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                             super__Vector_impl_data._M_start + local_188);
            std::__cxx11::string::string((string *)local_158,"xy",local_199);
            local_18c = (*(this->super_Lattice)._vptr_Lattice[2])
                                  (this,uVar4 & 0xffffffff,
                                   (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
                                    *)local_158,1);
            std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar6,&local_18c);
            std::__cxx11::string::~string((string *)local_158);
            pvVar6 = (vector<int,_std::allocator<int>_> *)
                     ((long)&((vertexToUpEdges.
                               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->
                             super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                             super__Vector_impl_data._M_start + local_188);
            std::__cxx11::string::string((string *)local_158,"xz",local_199);
            local_18c = (*(this->super_Lattice)._vptr_Lattice[2])
                                  (this,uVar4 & 0xffffffff,
                                   (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
                                    *)local_158,1);
            std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar6,&local_18c);
            std::__cxx11::string::~string((string *)local_158);
            pvVar6 = (vector<int,_std::allocator<int>_> *)
                     ((long)&((vertexToUpEdges.
                               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->
                             super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                             super__Vector_impl_data._M_start + local_188);
            std::__cxx11::string::string((string *)local_158,"yz",local_199);
            local_18c = (*(this->super_Lattice)._vptr_Lattice[2])
                                  (this,uVar4 & 0xffffffff,
                                   (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
                                    *)local_158,1);
            std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar6,&local_18c);
          }
          else {
            bVar2 = std::operator==(__x,"yz");
            if (bVar2) {
              pvVar6 = (vector<int,_std::allocator<int>_> *)
                       ((long)&((vertexToUpEdges.
                                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->
                               super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                               super__Vector_impl_data._M_start + local_188);
              std::__cxx11::string::string((string *)local_158,"yz",local_199);
              local_18c = (*(this->super_Lattice)._vptr_Lattice[2])
                                    (this,uVar4 & 0xffffffff,(string *)local_158,1);
              std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar6,&local_18c);
              std::__cxx11::string::~string((string *)local_158);
              pvVar6 = (vector<int,_std::allocator<int>_> *)
                       ((long)&((vertexToUpEdges.
                                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->
                               super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                               super__Vector_impl_data._M_start + local_188);
              std::__cxx11::string::string((string *)local_158,"xyz",local_199);
              local_18c = (*(this->super_Lattice)._vptr_Lattice[2])
                                    (this,uVar4 & 0xffffffff,(string *)local_158,1);
              std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar6,&local_18c);
              std::__cxx11::string::~string((string *)local_158);
              pvVar6 = (vector<int,_std::allocator<int>_> *)
                       ((long)&((vertexToUpEdges.
                                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->
                               super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                               super__Vector_impl_data._M_start + local_188);
              std::__cxx11::string::string((string *)local_158,"xy",local_199);
              local_18c = (*(this->super_Lattice)._vptr_Lattice[2])
                                    (this,uVar4 & 0xffffffff,(string *)local_158,0xffffffff);
              std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar6,&local_18c);
              std::__cxx11::string::~string((string *)local_158);
              pvVar6 = (vector<int,_std::allocator<int>_> *)
                       ((long)&((vertexToUpEdges.
                                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->
                               super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                               super__Vector_impl_data._M_start + local_188);
              std::__cxx11::string::string((string *)local_158,"xz",local_199);
              local_18c = (*(this->super_Lattice)._vptr_Lattice[2])
                                    (this,uVar4 & 0xffffffff,(string *)local_158,0xffffffff);
              std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar6,&local_18c);
            }
            else {
              bVar2 = std::operator==(__x,"xz");
              if (bVar2) {
                pvVar6 = (vector<int,_std::allocator<int>_> *)
                         ((long)&((vertexToUpEdges.
                                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->
                                 super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                 super__Vector_impl_data._M_start + local_188);
                std::__cxx11::string::string((string *)local_158,"xyz",local_199);
                local_18c = (*(this->super_Lattice)._vptr_Lattice[2])
                                      (this,uVar4 & 0xffffffff,(string *)local_158,1);
                std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar6,&local_18c);
                std::__cxx11::string::~string((string *)local_158);
                pvVar6 = (vector<int,_std::allocator<int>_> *)
                         ((long)&((vertexToUpEdges.
                                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->
                                 super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                 super__Vector_impl_data._M_start + local_188);
                std::__cxx11::string::string((string *)local_158,"xz",local_199);
                local_18c = (*(this->super_Lattice)._vptr_Lattice[2])
                                      (this,uVar4 & 0xffffffff,(string *)local_158,1);
                std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar6,&local_18c);
                std::__cxx11::string::~string((string *)local_158);
                pvVar6 = (vector<int,_std::allocator<int>_> *)
                         ((long)&((vertexToUpEdges.
                                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->
                                 super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                 super__Vector_impl_data._M_start + local_188);
                std::__cxx11::string::string((string *)local_158,"xy",local_199);
                local_18c = (*(this->super_Lattice)._vptr_Lattice[2])
                                      (this,uVar4 & 0xffffffff,(string *)local_158,0xffffffff);
                std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar6,&local_18c);
                std::__cxx11::string::~string((string *)local_158);
                pvVar6 = (vector<int,_std::allocator<int>_> *)
                         ((long)&((vertexToUpEdges.
                                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->
                                 super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                 super__Vector_impl_data._M_start + local_188);
                std::__cxx11::string::string((string *)local_158,"yz",local_199);
                local_18c = (*(this->super_Lattice)._vptr_Lattice[2])
                                      (this,uVar4 & 0xffffffff,(string *)local_158,0xffffffff);
                std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar6,&local_18c);
              }
              else {
                bVar2 = std::operator==(__x,"xy");
                if (bVar2) {
                  pvVar6 = (vector<int,_std::allocator<int>_> *)
                           ((long)&((vertexToUpEdges.
                                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->
                                   super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                   super__Vector_impl_data._M_start + local_188);
                  std::__cxx11::string::string((string *)local_158,"xyz",local_199);
                  local_18c = (*(this->super_Lattice)._vptr_Lattice[2])
                                        (this,uVar4 & 0xffffffff,(string *)local_158,1);
                  std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar6,&local_18c);
                  std::__cxx11::string::~string((string *)local_158);
                  pvVar6 = (vector<int,_std::allocator<int>_> *)
                           ((long)&((vertexToUpEdges.
                                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->
                                   super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                   super__Vector_impl_data._M_start + local_188);
                  std::__cxx11::string::string((string *)local_158,"xy",local_199);
                  local_18c = (*(this->super_Lattice)._vptr_Lattice[2])
                                        (this,uVar4 & 0xffffffff,(string *)local_158,1);
                  std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar6,&local_18c);
                  std::__cxx11::string::~string((string *)local_158);
                  pvVar6 = (vector<int,_std::allocator<int>_> *)
                           ((long)&((vertexToUpEdges.
                                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->
                                   super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                   super__Vector_impl_data._M_start + local_188);
                  std::__cxx11::string::string((string *)local_158,"xz",local_199);
                  local_18c = (*(this->super_Lattice)._vptr_Lattice[2])
                                        (this,uVar4 & 0xffffffff,(string *)local_158,0xffffffff);
                  std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar6,&local_18c);
                  std::__cxx11::string::~string((string *)local_158);
                  pvVar6 = (vector<int,_std::allocator<int>_> *)
                           ((long)&((vertexToUpEdges.
                                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->
                                   super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                   super__Vector_impl_data._M_start + local_188);
                  std::__cxx11::string::string((string *)local_158,"yz",local_199);
                  local_18c = (*(this->super_Lattice)._vptr_Lattice[2])
                                        (this,uVar4 & 0xffffffff,(string *)local_158,0xffffffff);
                  std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar6,&local_18c);
                }
                else {
                  bVar2 = std::operator==(__x,"-xyz");
                  if (bVar2) {
                    pvVar6 = (vector<int,_std::allocator<int>_> *)
                             ((long)&((vertexToUpEdges.
                                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->
                                     super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                     super__Vector_impl_data._M_start + local_188);
                    std::__cxx11::string::string((string *)local_158,"xyz",local_199);
                    local_18c = (*(this->super_Lattice)._vptr_Lattice[2])
                                          (this,uVar4 & 0xffffffff,(string *)local_158,0xffffffff);
                    std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar6,&local_18c);
                    std::__cxx11::string::~string((string *)local_158);
                    pvVar6 = (vector<int,_std::allocator<int>_> *)
                             ((long)&((vertexToUpEdges.
                                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->
                                     super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                     super__Vector_impl_data._M_start + local_188);
                    std::__cxx11::string::string((string *)local_158,"xz",local_199);
                    local_18c = (*(this->super_Lattice)._vptr_Lattice[2])
                                          (this,uVar4 & 0xffffffff,(string *)local_158,0xffffffff);
                    std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar6,&local_18c);
                    std::__cxx11::string::~string((string *)local_158);
                    pvVar6 = (vector<int,_std::allocator<int>_> *)
                             ((long)&((vertexToUpEdges.
                                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->
                                     super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                     super__Vector_impl_data._M_start + local_188);
                    std::__cxx11::string::string((string *)local_158,"xy",local_199);
                    local_18c = (*(this->super_Lattice)._vptr_Lattice[2])
                                          (this,uVar4 & 0xffffffff,(string *)local_158,0xffffffff);
                    std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar6,&local_18c);
                    std::__cxx11::string::~string((string *)local_158);
                    pvVar6 = (vector<int,_std::allocator<int>_> *)
                             ((long)&((vertexToUpEdges.
                                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->
                                     super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                     super__Vector_impl_data._M_start + local_188);
                    std::__cxx11::string::string((string *)local_158,"yz",local_199);
                    local_18c = (*(this->super_Lattice)._vptr_Lattice[2])
                                          (this,uVar4 & 0xffffffff,(string *)local_158,0xffffffff);
                    std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar6,&local_18c);
                  }
                  else {
                    bVar2 = std::operator==(__x,"-yz");
                    if (bVar2) {
                      pvVar6 = (vector<int,_std::allocator<int>_> *)
                               ((long)&((vertexToUpEdges.
                                         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->
                                       super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                       super__Vector_impl_data._M_start + local_188);
                      std::__cxx11::string::string((string *)local_158,"xy",local_199);
                      local_18c = (*(this->super_Lattice)._vptr_Lattice[2])
                                            (this,uVar4 & 0xffffffff,(string *)local_158,1);
                      std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar6,&local_18c);
                      std::__cxx11::string::~string((string *)local_158);
                      pvVar6 = (vector<int,_std::allocator<int>_> *)
                               ((long)&((vertexToUpEdges.
                                         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->
                                       super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                       super__Vector_impl_data._M_start + local_188);
                      std::__cxx11::string::string((string *)local_158,"xz",local_199);
                      local_18c = (*(this->super_Lattice)._vptr_Lattice[2])
                                            (this,uVar4 & 0xffffffff,(string *)local_158,1);
                      std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar6,&local_18c);
                      std::__cxx11::string::~string((string *)local_158);
                      pvVar6 = (vector<int,_std::allocator<int>_> *)
                               ((long)&((vertexToUpEdges.
                                         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->
                                       super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                       super__Vector_impl_data._M_start + local_188);
                      std::__cxx11::string::string((string *)local_158,"xyz",local_199);
                      local_18c = (*(this->super_Lattice)._vptr_Lattice[2])
                                            (this,uVar4 & 0xffffffff,(string *)local_158,0xffffffff)
                      ;
                      std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar6,&local_18c);
                      std::__cxx11::string::~string((string *)local_158);
                      pvVar6 = (vector<int,_std::allocator<int>_> *)
                               ((long)&((vertexToUpEdges.
                                         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->
                                       super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                       super__Vector_impl_data._M_start + local_188);
                      std::__cxx11::string::string((string *)local_158,"yz",local_199);
                      local_18c = (*(this->super_Lattice)._vptr_Lattice[2])
                                            (this,uVar4 & 0xffffffff,(string *)local_158,0xffffffff)
                      ;
                      std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar6,&local_18c);
                    }
                    else {
                      bVar2 = std::operator==(__x,"-xz");
                      if (bVar2) {
                        pvVar6 = (vector<int,_std::allocator<int>_> *)
                                 ((long)&((vertexToUpEdges.
                                           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->
                                         super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                         super__Vector_impl_data._M_start + local_188);
                        std::__cxx11::string::string((string *)local_158,"xy",local_199);
                        local_18c = (*(this->super_Lattice)._vptr_Lattice[2])
                                              (this,uVar4 & 0xffffffff,(string *)local_158,1);
                        std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar6,&local_18c)
                        ;
                        std::__cxx11::string::~string((string *)local_158);
                        pvVar6 = (vector<int,_std::allocator<int>_> *)
                                 ((long)&((vertexToUpEdges.
                                           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->
                                         super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                         super__Vector_impl_data._M_start + local_188);
                        std::__cxx11::string::string((string *)local_158,"yz",local_199);
                        local_18c = (*(this->super_Lattice)._vptr_Lattice[2])
                                              (this,uVar4 & 0xffffffff,(string *)local_158,1);
                        std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar6,&local_18c)
                        ;
                        std::__cxx11::string::~string((string *)local_158);
                        pvVar6 = (vector<int,_std::allocator<int>_> *)
                                 ((long)&((vertexToUpEdges.
                                           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->
                                         super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                         super__Vector_impl_data._M_start + local_188);
                        std::__cxx11::string::string((string *)local_158,"xyz",local_199);
                        local_18c = (*(this->super_Lattice)._vptr_Lattice[2])
                                              (this,uVar4 & 0xffffffff,(string *)local_158,
                                               0xffffffff);
                        std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar6,&local_18c)
                        ;
                        std::__cxx11::string::~string((string *)local_158);
                        pvVar6 = (vector<int,_std::allocator<int>_> *)
                                 ((long)&((vertexToUpEdges.
                                           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->
                                         super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                         super__Vector_impl_data._M_start + local_188);
                        std::__cxx11::string::string((string *)local_158,"xz",local_199);
                        local_18c = (*(this->super_Lattice)._vptr_Lattice[2])
                                              (this,uVar4 & 0xffffffff,(string *)local_158,
                                               0xffffffff);
                        std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar6,&local_18c)
                        ;
                      }
                      else {
                        bVar2 = std::operator==(__x,"-xy");
                        if (!bVar2) goto LAB_00127a2e;
                        pvVar6 = (vector<int,_std::allocator<int>_> *)
                                 ((long)&((vertexToUpEdges.
                                           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->
                                         super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                         super__Vector_impl_data._M_start + local_188);
                        std::__cxx11::string::string((string *)local_158,"xz",local_199);
                        local_18c = (*(this->super_Lattice)._vptr_Lattice[2])
                                              (this,uVar4 & 0xffffffff,(string *)local_158,1);
                        std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar6,&local_18c)
                        ;
                        std::__cxx11::string::~string((string *)local_158);
                        pvVar6 = (vector<int,_std::allocator<int>_> *)
                                 ((long)&((vertexToUpEdges.
                                           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->
                                         super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                         super__Vector_impl_data._M_start + local_188);
                        std::__cxx11::string::string((string *)local_158,"yz",local_199);
                        local_18c = (*(this->super_Lattice)._vptr_Lattice[2])
                                              (this,uVar4 & 0xffffffff,(string *)local_158,1);
                        std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar6,&local_18c)
                        ;
                        std::__cxx11::string::~string((string *)local_158);
                        pvVar6 = (vector<int,_std::allocator<int>_> *)
                                 ((long)&((vertexToUpEdges.
                                           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->
                                         super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                         super__Vector_impl_data._M_start + local_188);
                        std::__cxx11::string::string((string *)local_158,"xyz",local_199);
                        local_18c = (*(this->super_Lattice)._vptr_Lattice[2])
                                              (this,uVar4 & 0xffffffff,(string *)local_158,
                                               0xffffffff);
                        std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar6,&local_18c)
                        ;
                        std::__cxx11::string::~string((string *)local_158);
                        pvVar6 = (vector<int,_std::allocator<int>_> *)
                                 ((long)&((vertexToUpEdges.
                                           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->
                                         super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                         super__Vector_impl_data._M_start + local_188);
                        std::__cxx11::string::string((string *)local_158,"xy",local_199);
                        local_18c = (*(this->super_Lattice)._vptr_Lattice[2])
                                              (this,uVar4 & 0xffffffff,(string *)local_158,
                                               0xffffffff);
                        std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar6,&local_18c)
                        ;
                      }
                    }
                  }
                }
              }
            }
          }
          goto LAB_00127a26;
        }
      }
      else if (uVar3 == 1) {
        bVar2 = std::operator==(__x,"xy");
        if (!bVar2) {
          bVar2 = std::operator==(__x,"xz");
          if (!bVar2) {
            bVar2 = std::operator==(__x,"yz");
            if (!bVar2) {
              bVar2 = std::operator==(__x,"-xyz");
              if (!bVar2) {
                bVar2 = std::operator==(__x,"xyz");
                if (bVar2) {
                  pvVar6 = (vector<int,_std::allocator<int>_> *)
                           ((long)&((vertexToUpEdges.
                                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->
                                   super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                   super__Vector_impl_data._M_start + local_188);
                  std::__cxx11::string::string((string *)local_158,"xy",local_199);
                  local_18c = (*(this->super_Lattice)._vptr_Lattice[2])
                                        (this,uVar4 & 0xffffffff,
                                         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
                                          *)local_158,1);
                  std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar6,&local_18c);
                  std::__cxx11::string::~string((string *)local_158);
                  pvVar6 = (vector<int,_std::allocator<int>_> *)
                           ((long)&((vertexToUpEdges.
                                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->
                                   super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                   super__Vector_impl_data._M_start + local_188);
                  std::__cxx11::string::string((string *)local_158,"xz",local_199);
                  local_18c = (*(this->super_Lattice)._vptr_Lattice[2])
                                        (this,uVar4 & 0xffffffff,
                                         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
                                          *)local_158,1);
                  std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar6,&local_18c);
                  std::__cxx11::string::~string((string *)local_158);
                  pvVar6 = (vector<int,_std::allocator<int>_> *)
                           ((long)&((vertexToUpEdges.
                                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->
                                   super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                   super__Vector_impl_data._M_start + local_188);
                  std::__cxx11::string::string((string *)local_158,"yz",local_199);
                  local_18c = (*(this->super_Lattice)._vptr_Lattice[2])
                                        (this,uVar4 & 0xffffffff,
                                         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
                                          *)local_158,1);
                  std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar6,&local_18c);
                }
                else {
                  bVar2 = std::operator==(__x,"-xy");
                  if (bVar2) {
                    pvVar6 = (vector<int,_std::allocator<int>_> *)
                             ((long)&((vertexToUpEdges.
                                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->
                                     super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                     super__Vector_impl_data._M_start + local_188);
                    std::__cxx11::string::string((string *)local_158,"xyz",local_199);
                    local_18c = (*(this->super_Lattice)._vptr_Lattice[2])
                                          (this,uVar4 & 0xffffffff,
                                           (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
                                            *)local_158,0xffffffff);
                    std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar6,&local_18c);
                    std::__cxx11::string::~string((string *)local_158);
                    pvVar6 = (vector<int,_std::allocator<int>_> *)
                             ((long)&((vertexToUpEdges.
                                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->
                                     super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                     super__Vector_impl_data._M_start + local_188);
                    std::__cxx11::string::string((string *)local_158,"xz",local_199);
                    local_18c = (*(this->super_Lattice)._vptr_Lattice[2])
                                          (this,uVar4 & 0xffffffff,
                                           (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
                                            *)local_158,1);
                    std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar6,&local_18c);
                    std::__cxx11::string::~string((string *)local_158);
                    pvVar6 = (vector<int,_std::allocator<int>_> *)
                             ((long)&((vertexToUpEdges.
                                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->
                                     super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                     super__Vector_impl_data._M_start + local_188);
                    std::__cxx11::string::string((string *)local_158,"yz",local_199);
                    local_18c = (*(this->super_Lattice)._vptr_Lattice[2])
                                          (this,uVar4 & 0xffffffff,
                                           (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
                                            *)local_158,1);
                    std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar6,&local_18c);
                  }
                  else {
                    bVar2 = std::operator==(__x,"-xz");
                    if (bVar2) {
                      pvVar6 = (vector<int,_std::allocator<int>_> *)
                               ((long)&((vertexToUpEdges.
                                         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->
                                       super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                       super__Vector_impl_data._M_start + local_188);
                      std::__cxx11::string::string((string *)local_158,"xyz",local_199);
                      local_18c = (*(this->super_Lattice)._vptr_Lattice[2])
                                            (this,uVar4 & 0xffffffff,
                                             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
                                              *)local_158,0xffffffff);
                      std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar6,&local_18c);
                      std::__cxx11::string::~string((string *)local_158);
                      pvVar6 = (vector<int,_std::allocator<int>_> *)
                               ((long)&((vertexToUpEdges.
                                         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->
                                       super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                       super__Vector_impl_data._M_start + local_188);
                      std::__cxx11::string::string((string *)local_158,"xy",local_199);
                      local_18c = (*(this->super_Lattice)._vptr_Lattice[2])
                                            (this,uVar4 & 0xffffffff,
                                             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
                                              *)local_158,1);
                      std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar6,&local_18c);
                      std::__cxx11::string::~string((string *)local_158);
                      pvVar6 = (vector<int,_std::allocator<int>_> *)
                               ((long)&((vertexToUpEdges.
                                         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->
                                       super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                       super__Vector_impl_data._M_start + local_188);
                      std::__cxx11::string::string((string *)local_158,"yz",local_199);
                      local_18c = (*(this->super_Lattice)._vptr_Lattice[2])
                                            (this,uVar4 & 0xffffffff,
                                             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
                                              *)local_158,1);
                      std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar6,&local_18c);
                    }
                    else {
                      bVar2 = std::operator==(__x,"-yz");
                      if (!bVar2) goto LAB_00127a2e;
                      pvVar6 = (vector<int,_std::allocator<int>_> *)
                               ((long)&((vertexToUpEdges.
                                         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->
                                       super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                       super__Vector_impl_data._M_start + local_188);
                      std::__cxx11::string::string((string *)local_158,"xyz",local_199);
                      local_18c = (*(this->super_Lattice)._vptr_Lattice[2])
                                            (this,uVar4 & 0xffffffff,
                                             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
                                              *)local_158,0xffffffff);
                      std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar6,&local_18c);
                      std::__cxx11::string::~string((string *)local_158);
                      pvVar6 = (vector<int,_std::allocator<int>_> *)
                               ((long)&((vertexToUpEdges.
                                         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->
                                       super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                       super__Vector_impl_data._M_start + local_188);
                      std::__cxx11::string::string((string *)local_158,"xz",local_199);
                      local_18c = (*(this->super_Lattice)._vptr_Lattice[2])
                                            (this,uVar4 & 0xffffffff,
                                             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
                                              *)local_158,1);
                      std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar6,&local_18c);
                      std::__cxx11::string::~string((string *)local_158);
                      pvVar6 = (vector<int,_std::allocator<int>_> *)
                               ((long)&((vertexToUpEdges.
                                         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->
                                       super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                       super__Vector_impl_data._M_start + local_188);
                      std::__cxx11::string::string((string *)local_158,"xy",local_199);
                      local_18c = (*(this->super_Lattice)._vptr_Lattice[2])
                                            (this,uVar4 & 0xffffffff,
                                             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
                                              *)local_158,1);
                      std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar6,&local_18c);
                    }
                  }
                }
LAB_00127a26:
                std::__cxx11::string::~string((string *)local_158);
              }
            }
          }
        }
      }
      else {
        bVar2 = std::operator==(__x,"-xy");
        if (!bVar2) {
          bVar2 = std::operator==(__x,"-xz");
          if (!bVar2) {
            bVar2 = std::operator==(__x,"-yz");
            if (!bVar2) {
              bVar2 = std::operator==(__x,"xyz");
              if (!bVar2) {
                bVar2 = std::operator==(__x,"-xyz");
                if (bVar2) {
                  pvVar6 = (vector<int,_std::allocator<int>_> *)
                           ((long)&((vertexToUpEdges.
                                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->
                                   super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                   super__Vector_impl_data._M_start + local_188);
                  std::__cxx11::string::string((string *)local_158,"xy",local_199);
                  local_18c = (*(this->super_Lattice)._vptr_Lattice[2])
                                        (this,uVar4 & 0xffffffff,
                                         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
                                          *)local_158,0xffffffff);
                  std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar6,&local_18c);
                  std::__cxx11::string::~string((string *)local_158);
                  pvVar6 = (vector<int,_std::allocator<int>_> *)
                           ((long)&((vertexToUpEdges.
                                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->
                                   super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                   super__Vector_impl_data._M_start + local_188);
                  std::__cxx11::string::string((string *)local_158,"xz",local_199);
                  local_18c = (*(this->super_Lattice)._vptr_Lattice[2])
                                        (this,uVar4 & 0xffffffff,
                                         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
                                          *)local_158,0xffffffff);
                  std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar6,&local_18c);
                  std::__cxx11::string::~string((string *)local_158);
                  pvVar6 = (vector<int,_std::allocator<int>_> *)
                           ((long)&((vertexToUpEdges.
                                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->
                                   super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                   super__Vector_impl_data._M_start + local_188);
                  std::__cxx11::string::string((string *)local_158,"yz",local_199);
                  local_18c = (*(this->super_Lattice)._vptr_Lattice[2])
                                        (this,uVar4 & 0xffffffff,
                                         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
                                          *)local_158,0xffffffff);
                  std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar6,&local_18c);
                }
                else {
                  bVar2 = std::operator==(__x,"xy");
                  if (bVar2) {
                    pvVar6 = (vector<int,_std::allocator<int>_> *)
                             ((long)&((vertexToUpEdges.
                                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->
                                     super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                     super__Vector_impl_data._M_start + local_188);
                    std::__cxx11::string::string((string *)local_158,"xyz",local_199);
                    local_18c = (*(this->super_Lattice)._vptr_Lattice[2])
                                          (this,uVar4 & 0xffffffff,
                                           (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
                                            *)local_158,1);
                    std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar6,&local_18c);
                    std::__cxx11::string::~string((string *)local_158);
                    pvVar6 = (vector<int,_std::allocator<int>_> *)
                             ((long)&((vertexToUpEdges.
                                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->
                                     super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                     super__Vector_impl_data._M_start + local_188);
                    std::__cxx11::string::string((string *)local_158,"xz",local_199);
                    local_18c = (*(this->super_Lattice)._vptr_Lattice[2])
                                          (this,uVar4 & 0xffffffff,
                                           (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
                                            *)local_158,0xffffffff);
                    std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar6,&local_18c);
                    std::__cxx11::string::~string((string *)local_158);
                    pvVar6 = (vector<int,_std::allocator<int>_> *)
                             ((long)&((vertexToUpEdges.
                                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->
                                     super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                     super__Vector_impl_data._M_start + local_188);
                    std::__cxx11::string::string((string *)local_158,"yz",local_199);
                    local_18c = (*(this->super_Lattice)._vptr_Lattice[2])
                                          (this,uVar4 & 0xffffffff,
                                           (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
                                            *)local_158,0xffffffff);
                    std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar6,&local_18c);
                  }
                  else {
                    bVar2 = std::operator==(__x,"xz");
                    if (bVar2) {
                      pvVar6 = (vector<int,_std::allocator<int>_> *)
                               ((long)&((vertexToUpEdges.
                                         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->
                                       super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                       super__Vector_impl_data._M_start + local_188);
                      std::__cxx11::string::string((string *)local_158,"xyz",local_199);
                      local_18c = (*(this->super_Lattice)._vptr_Lattice[2])
                                            (this,uVar4 & 0xffffffff,
                                             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
                                              *)local_158,1);
                      std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar6,&local_18c);
                      std::__cxx11::string::~string((string *)local_158);
                      pvVar6 = (vector<int,_std::allocator<int>_> *)
                               ((long)&((vertexToUpEdges.
                                         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->
                                       super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                       super__Vector_impl_data._M_start + local_188);
                      std::__cxx11::string::string((string *)local_158,"xy",local_199);
                      local_18c = (*(this->super_Lattice)._vptr_Lattice[2])
                                            (this,uVar4 & 0xffffffff,
                                             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
                                              *)local_158,0xffffffff);
                      std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar6,&local_18c);
                      std::__cxx11::string::~string((string *)local_158);
                      pvVar6 = (vector<int,_std::allocator<int>_> *)
                               ((long)&((vertexToUpEdges.
                                         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->
                                       super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                       super__Vector_impl_data._M_start + local_188);
                      std::__cxx11::string::string((string *)local_158,"yz",local_199);
                      local_18c = (*(this->super_Lattice)._vptr_Lattice[2])
                                            (this,uVar4 & 0xffffffff,
                                             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
                                              *)local_158,0xffffffff);
                      std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar6,&local_18c);
                    }
                    else {
                      bVar2 = std::operator==(__x,"yz");
                      if (!bVar2) goto LAB_00127a2e;
                      pvVar6 = (vector<int,_std::allocator<int>_> *)
                               ((long)&((vertexToUpEdges.
                                         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->
                                       super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                       super__Vector_impl_data._M_start + local_188);
                      std::__cxx11::string::string((string *)local_158,"xyz",local_199);
                      local_18c = (*(this->super_Lattice)._vptr_Lattice[2])
                                            (this,uVar4 & 0xffffffff,
                                             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
                                              *)local_158,1);
                      std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar6,&local_18c);
                      std::__cxx11::string::~string((string *)local_158);
                      pvVar6 = (vector<int,_std::allocator<int>_> *)
                               ((long)&((vertexToUpEdges.
                                         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->
                                       super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                       super__Vector_impl_data._M_start + local_188);
                      std::__cxx11::string::string((string *)local_158,"xz",local_199);
                      local_18c = (*(this->super_Lattice)._vptr_Lattice[2])
                                            (this,uVar4 & 0xffffffff,
                                             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
                                              *)local_158,0xffffffff);
                      std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar6,&local_18c);
                      std::__cxx11::string::~string((string *)local_158);
                      pvVar6 = (vector<int,_std::allocator<int>_> *)
                               ((long)&((vertexToUpEdges.
                                         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->
                                       super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                       super__Vector_impl_data._M_start + local_188);
                      std::__cxx11::string::string((string *)local_158,"xy",local_199);
                      local_18c = (*(this->super_Lattice)._vptr_Lattice[2])
                                            (this,uVar4 & 0xffffffff,
                                             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
                                              *)local_158,0xffffffff);
                      std::vector<int,_std::allocator<int>_>::emplace_back<int>(pvVar6,&local_18c);
                    }
                  }
                }
                goto LAB_00127a26;
              }
            }
          }
        }
      }
LAB_00127a2e:
      uVar4 = uVar4 + 1;
      local_188 = local_188 + 0x18;
    }
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
    ::
    pair<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_&,_true>
              ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
                *)local_158,__x,&vertexToUpEdges);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>>>>
    ::
    _M_emplace_unique<std::pair<std::__cxx11::string,std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>>>
              (local_58,(pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
                         *)local_158);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
    ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
             *)local_158);
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::~vector(&vertexToUpEdges);
    __x = __x + 1;
  } while( true );
}

Assistant:

void RhombicLattice::createUpEdgesMap()
{
    std::vector<std::string> directionList = {"xyz", "xy", "xz", "yz",
                                              "-xyz", "-xy", "-xz", "-yz"};
    for (const auto &direction : directionList)
    {
        vvint vertexToUpEdges;
        vertexToUpEdges.assign(2 * l * l * l, {});
        for (int vertexIndex = 0; vertexIndex < 2 * l * l * l; ++vertexIndex)
        {
            cartesian4 coordinate = indexToCoordinate(vertexIndex);
            if (coordinate.w == 0)
            {
                if ((coordinate.x + coordinate.y + coordinate.z) % 2 == 1)
                {
                    if (direction == "xyz")
                    {
                        // Third argument is sign
                        try
                        {
                            vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "xyz", 1));
                        }
                        catch (const std::invalid_argument &e)
                        {
                            // Edge includes vertex outside lattice
                        }
                        try
                        {
                            vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "xy", 1));
                        }
                        catch (const std::invalid_argument &e)
                        {
                        }
                        try
                        {
                            vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "xz", 1));
                        }
                        catch (const std::invalid_argument &e)
                        {
                        }
                        try
                        {
                            vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "yz", 1));
                        }
                        catch (const std::invalid_argument &e)
                        {
                        }
                    }
                    else if (direction == "yz")
                    {
                        try
                        {
                            vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "yz", 1));
                        }
                        catch (const std::invalid_argument &e)
                        {
                        }
                        try
                        {
                            vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "xyz", 1));
                        }
                        catch (const std::invalid_argument &e)
                        {
                        }
                        try
                        {
                            vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "xy", -1));
                        }
                        catch (const std::invalid_argument &e)
                        {
                        }
                        try
                        {
                            vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "xz", -1));
                        }
                        catch (const std::invalid_argument &e)
                        {
                        }
                    }
                    else if (direction == "xz")
                    {
                        try
                        {
                            vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "xyz", 1));
                        }
                        catch (const std::invalid_argument &e)
                        {
                        }
                        try
                        {
                            vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "xz", 1));
                        }
                        catch (const std::invalid_argument &e)
                        {
                        }
                        try
                        {
                            vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "xy", -1));
                        }
                        catch (const std::invalid_argument &e)
                        {
                        }
                        try
                        {
                            vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "yz", -1));
                        }
                        catch (const std::invalid_argument &e)
                        {
                        }
                    }
                    else if (direction == "xy")
                    {
                        try
                        {
                            vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "xyz", 1));
                        }
                        catch (const std::invalid_argument &e)
                        {
                        }
                        try
                        {
                            vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "xy", 1));
                        }
                        catch (const std::invalid_argument &e)
                        {
                        }
                        try
                        {
                            vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "xz", -1));
                        }
                        catch (const std::invalid_argument &e)
                        {
                        }
                        try
                        {
                            vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "yz", -1));
                        }
                        catch (const std::invalid_argument &e)
                        {
                        }
                    }
                    else if (direction == "-xyz")
                    {
                        try
                        {
                            vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "xyz", -1));
                        }
                        catch (const std::invalid_argument &e)
                        {
                        }
                        try
                        {
                            vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "xz", -1));
                        }
                        catch (const std::invalid_argument &e)
                        {
                        }
                        try
                        {
                            vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "xy", -1));
                        }
                        catch (const std::invalid_argument &e)
                        {
                        }
                        try
                        {
                            vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "yz", -1));
                        }
                        catch (const std::invalid_argument &e)
                        {
                        }
                    }
                    else if (direction == "-yz")
                    {
                        try
                        {
                            vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "xy", 1));
                        }
                        catch (const std::invalid_argument &e)
                        {
                        }
                        try
                        {
                            vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "xz", 1));
                        }
                        catch (const std::invalid_argument &e)
                        {
                        }
                        try
                        {
                            vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "xyz", -1));
                        }
                        catch (const std::invalid_argument &e)
                        {
                        }
                        try
                        {
                            vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "yz", -1));
                        }
                        catch (std::invalid_argument &e)
                        {
                        }
                    }
                    else if (direction == "-xz")
                    {
                        try
                        {
                            vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "xy", 1));
                        }
                        catch (std::invalid_argument &e)
                        {
                        }
                        try
                        {
                            vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "yz", 1));
                        }
                        catch (std::invalid_argument &e)
                        {
                        }
                        try
                        {
                            vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "xyz", -1));
                        }
                        catch (std::invalid_argument &e)
                        {
                        }
                        try
                        {
                            vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "xz", -1));
                        }
                        catch (std::invalid_argument &e)
                        {
                        }
                    }
                    else if (direction == "-xy")
                    {
                        try
                        {
                            vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "xz", 1));
                        }
                        catch (std::invalid_argument &e)
                        {
                        }
                        try
                        {
                            vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "yz", 1));
                        }
                        catch (std::invalid_argument &e)
                        {
                        }
                        try
                        {
                            vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "xyz", -1));
                        }
                        catch (std::invalid_argument &e)
                        {
                        }
                        try
                        {
                            vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "xy", -1));
                        }
                        catch (std::invalid_argument &e)
                        {
                        }
                    }
                }
            }
            else
            {
                if ((coordinate.x + coordinate.y + coordinate.z) % 2 == 1)
                {
                    if (direction == "xy" || direction == "xz" || direction == "yz" || direction == "-xyz")
                    {
                        // Only one up edge, so return an empty vector as no sweep will happen here.
                    }
                    else
                    {
                        if (direction == "xyz")
                        {
                            try
                            {
                                vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "xy", 1));
                            }
                            catch (std::invalid_argument &e)
                            {
                            }
                            try
                            {
                                vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "xz", 1));
                            }
                            catch (std::invalid_argument &e)
                            {
                            }
                            try
                            {
                                vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "yz", 1));
                            }
                            catch (std::invalid_argument &e)
                            {
                            }
                        }
                        else if (direction == "-xy")
                        {
                            try
                            {
                                vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "xyz", -1));
                            }
                            catch (std::invalid_argument &e)
                            {
                            }
                            try
                            {
                                vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "xz", 1));
                            }
                            catch (std::invalid_argument &e)
                            {
                            }
                            try
                            {
                                vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "yz", 1));
                            }
                            catch (std::invalid_argument &e)
                            {
                            }
                        }
                        else if (direction == "-xz")
                        {
                            try
                            {
                                vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "xyz", -1));
                            }
                            catch (std::invalid_argument &e)
                            {
                            }
                            try
                            {
                                vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "xy", 1));
                            }
                            catch (std::invalid_argument &e)
                            {
                            }
                            try
                            {
                                vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "yz", 1));
                            }
                            catch (std::invalid_argument &e)
                            {
                            }
                        }
                        else if (direction == "-yz")
                        {
                            try
                            {
                                vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "xyz", -1));
                            }
                            catch (std::invalid_argument &e)
                            {
                            }
                            try
                            {
                                vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "xz", 1));
                            }
                            catch (std::invalid_argument &e)
                            {
                            }
                            try
                            {
                                vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "xy", 1));
                            }
                            catch (std::invalid_argument &e)
                            {
                            }
                        }
                    }
                }
                else
                {
                    if (direction == "-xy" || direction == "-xz" || direction == "-yz" || direction == "xyz")
                    {
                        // Only one up edge, so return an empty vector as no sweep will happen here.
                    }
                    else
                    {
                        if (direction == "-xyz")
                        {
                            try
                            {
                                vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "xy", -1));
                            }
                            catch (std::invalid_argument &e)
                            {
                            }
                            try
                            {
                                vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "xz", -1));
                            }
                            catch (std::invalid_argument &e)
                            {
                            }
                            try
                            {
                                vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "yz", -1));
                            }
                            catch (std::invalid_argument &e)
                            {
                            }
                        }
                        else if (direction == "xy")
                        {
                            try
                            {
                                vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "xyz", 1));
                            }
                            catch (std::invalid_argument &e)
                            {
                            }
                            try
                            {
                                vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "xz", -1));
                            }
                            catch (std::invalid_argument &e)
                            {
                            }
                            try
                            {
                                vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "yz", -1));
                            }
                            catch (std::invalid_argument &e)
                            {
                            }
                        }
                        else if (direction == "xz")
                        {
                            try
                            {
                                vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "xyz", 1));
                            }
                            catch (std::invalid_argument &e)
                            {
                            }
                            try
                            {
                                vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "xy", -1));
                            }
                            catch (std::invalid_argument &e)
                            {
                            }
                            try
                            {
                                vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "yz", -1));
                            }
                            catch (std::invalid_argument &e)
                            {
                            }
                        }
                        else if (direction == "yz")
                        {
                            try
                            {
                                vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "xyz", 1));
                            }
                            catch (std::invalid_argument &e)
                            {
                            }
                            try
                            {
                                vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "xz", -1));
                            }
                            catch (std::invalid_argument &e)
                            {
                            }
                            try
                            {
                                vertexToUpEdges[vertexIndex].push_back(edgeIndex(vertexIndex, "xy", -1));
                            }
                            catch (std::invalid_argument &e)
                            {
                            }
                        }
                    }
                }
            }
        }
        upEdgesMap.insert(std::pair<std::string, vvint>(direction, vertexToUpEdges));
    }
}